

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_vector_of_tags.hpp
# Opt level: O0

string * __thiscall
cfgfile::tag_vector_of_tags_t<cfg::tag_tags_t<cfgfile::string_trait_t>,cfgfile::string_trait_t>::
print_abi_cxx11_(tag_vector_of_tags_t<cfg::tag_tags_t<cfgfile::string_trait_t>,_cfgfile::string_trait_t>
                 *this,int indent)

{
  bool bVar1;
  element_type *peVar2;
  uint in_EDX;
  long in_RSI;
  string *in_RDI;
  ptr_to_tag_t *p;
  const_iterator __end0;
  const_iterator __begin0;
  vector_of_tags_t *__range3;
  string_t *result;
  string *__lhs;
  tag_t<cfgfile::string_trait_t> *in_stack_ffffffffffffff98;
  __normal_iterator<const_std::shared_ptr<cfg::tag_tags_t<cfgfile::string_trait_t>_>_*,_std::vector<std::shared_ptr<cfg::tag_tags_t<cfgfile::string_trait_t>_>,_std::allocator<std::shared_ptr<cfg::tag_tags_t<cfgfile::string_trait_t>_>_>_>_>
  local_38;
  long local_30;
  undefined1 local_15;
  uint local_14;
  
  local_15 = 0;
  __lhs = in_RDI;
  local_14 = in_EDX;
  std::__cxx11::string::string(in_RDI);
  bVar1 = tag_t<cfgfile::string_trait_t>::is_defined(in_stack_ffffffffffffff98);
  if (bVar1) {
    local_30 = in_RSI + 0x60;
    local_38._M_current =
         (shared_ptr<cfg::tag_tags_t<cfgfile::string_trait_t>_> *)
         std::
         vector<std::shared_ptr<cfg::tag_tags_t<cfgfile::string_trait_t>_>,_std::allocator<std::shared_ptr<cfg::tag_tags_t<cfgfile::string_trait_t>_>_>_>
         ::begin((vector<std::shared_ptr<cfg::tag_tags_t<cfgfile::string_trait_t>_>,_std::allocator<std::shared_ptr<cfg::tag_tags_t<cfgfile::string_trait_t>_>_>_>
                  *)in_RDI);
    std::
    vector<std::shared_ptr<cfg::tag_tags_t<cfgfile::string_trait_t>_>,_std::allocator<std::shared_ptr<cfg::tag_tags_t<cfgfile::string_trait_t>_>_>_>
    ::end((vector<std::shared_ptr<cfg::tag_tags_t<cfgfile::string_trait_t>_>,_std::allocator<std::shared_ptr<cfg::tag_tags_t<cfgfile::string_trait_t>_>_>_>
           *)in_RDI);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_std::shared_ptr<cfg::tag_tags_t<cfgfile::string_trait_t>_>_*,_std::vector<std::shared_ptr<cfg::tag_tags_t<cfgfile::string_trait_t>_>,_std::allocator<std::shared_ptr<cfg::tag_tags_t<cfgfile::string_trait_t>_>_>_>_>
                               *)__lhs,(__normal_iterator<const_std::shared_ptr<cfg::tag_tags_t<cfgfile::string_trait_t>_>_*,_std::vector<std::shared_ptr<cfg::tag_tags_t<cfgfile::string_trait_t>_>,_std::allocator<std::shared_ptr<cfg::tag_tags_t<cfgfile::string_trait_t>_>_>_>_>
                                        *)in_RDI), bVar1) {
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<cfg::tag_tags_t<cfgfile::string_trait_t>_>_*,_std::vector<std::shared_ptr<cfg::tag_tags_t<cfgfile::string_trait_t>_>,_std::allocator<std::shared_ptr<cfg::tag_tags_t<cfgfile::string_trait_t>_>_>_>_>
      ::operator*(&local_38);
      peVar2 = std::
               __shared_ptr_access<cfg::tag_tags_t<cfgfile::string_trait_t>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cfg::tag_tags_t<cfgfile::string_trait_t>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x13ab72);
      (*(peVar2->super_tag_no_value_t<cfgfile::string_trait_t>).super_tag_t<cfgfile::string_trait_t>
        ._vptr_tag_t[3])(&stack0xffffffffffffff98,peVar2,(ulong)local_14);
      std::__cxx11::string::append(in_RDI);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<cfg::tag_tags_t<cfgfile::string_trait_t>_>_*,_std::vector<std::shared_ptr<cfg::tag_tags_t<cfgfile::string_trait_t>_>,_std::allocator<std::shared_ptr<cfg::tag_tags_t<cfgfile::string_trait_t>_>_>_>_>
      ::operator++(&local_38);
    }
  }
  return __lhs;
}

Assistant:

typename Trait::string_t print( int indent = 0 ) const override
	{
		typename Trait::string_t result;

		if( this->is_defined() )
		{
			for( const ptr_to_tag_t & p : m_tags )
				result.append( p->print( indent ) );
		}

		return result;
	}